

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

char * cp_tok2str(CPState *cp,CPToken tok)

{
  char *pcVar1;
  
  if (0xff < tok) {
    return ctoknames[tok - 0x100];
  }
  if ((""[(long)tok + 1] & 1) == 0) {
    pcVar1 = "%c";
  }
  else {
    pcVar1 = "char(%d)";
  }
  pcVar1 = lj_strfmt_pushf(cp->L,pcVar1);
  return pcVar1;
}

Assistant:

static const char *cp_tok2str(CPState *cp, CPToken tok)
{
  lj_assertCP(tok < CTOK_FIRSTDECL, "bad CPToken %d", tok);
  if (tok > CTOK_OFS)
    return ctoknames[tok-CTOK_OFS-1];
  else if (!lj_char_iscntrl(tok))
    return lj_strfmt_pushf(cp->L, "%c", tok);
  else
    return lj_strfmt_pushf(cp->L, "char(%d)", tok);
}